

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::LE_Fire_PDU::Encode(LE_Fire_PDU *this,KDataStream *stream)

{
  KUINT16 KVar1;
  WarheadType WVar2;
  FuseType FVar3;
  EntityType *DTB;
  KDataStream *pKVar4;
  LE_Fire_PDU *self;
  KDataStream *stream_local;
  LE_Fire_PDU *this_local;
  
  checkFlagsAndPDULength(this);
  LE_Header::Encode(&this->super_LE_Header,stream);
  KDataStream::operator<<(stream,(this->m_FireFlagUnion).m_ui8Flag);
  if (((this->m_FireFlagUnion).m_ui8Flag & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_TargetID).super_DataTypeBase);
  }
  if (((this->m_FireFlagUnion).m_ui8Flag >> 2 & 1) != 0) {
    if (((this->m_FireFlagUnion).m_ui8Flag >> 1 & 1) == 0) {
      KVar1 = DATA_TYPE::LE_EntityIdentifier::GetEntityID(&this->m_MunitionID);
      KDataStream::operator<<(stream,KVar1);
    }
    else {
      DATA_TYPE::operator<<(stream,&(this->m_MunitionID).super_DataTypeBase);
    }
  }
  if (((this->m_FireFlagUnion).m_ui8Flag >> 3 & 1) == 0) {
    KVar1 = DATA_TYPE::LE_EntityIdentifier::GetEntityID(&this->m_EventID);
    KDataStream::operator<<(stream,KVar1);
  }
  else {
    DATA_TYPE::operator<<(stream,&(this->m_EventID).super_DataTypeBase);
  }
  if (((this->m_FireFlagUnion).m_ui8Flag >> 6 & 1) != 0) {
    DATA_TYPE::operator<<(stream,&(this->m_Loc).super_DataTypeBase);
  }
  DTB = DATA_TYPE::Descriptor::GetType(&(this->m_MunitionDesc).super_Descriptor);
  DATA_TYPE::operator<<(stream,&DTB->super_DataTypeBase);
  if (((this->m_FireFlagUnion).m_ui8Flag >> 4 & 1) != 0) {
    WVar2 = DATA_TYPE::MunitionDescriptor::GetWarhead(&this->m_MunitionDesc);
    pKVar4 = KDataStream::operator<<(stream,(unsigned_short)WVar2);
    FVar3 = DATA_TYPE::MunitionDescriptor::GetFuse(&this->m_MunitionDesc);
    KDataStream::operator<<(pKVar4,(unsigned_short)FVar3);
  }
  if (((this->m_FireFlagUnion).m_ui8Flag >> 5 & 1) != 0) {
    KVar1 = DATA_TYPE::MunitionDescriptor::GetQuantity(&this->m_MunitionDesc);
    pKVar4 = KDataStream::operator<<(stream,KVar1);
    KVar1 = DATA_TYPE::MunitionDescriptor::GetRate(&this->m_MunitionDesc);
    KDataStream::operator<<(pKVar4,KVar1);
  }
  pKVar4 = DATA_TYPE::operator<<(stream,&(this->m_Vel).super_DataTypeBase);
  KDataStream::operator<<(pKVar4,this->m_ui16Range);
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 != (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) {
    __assert_fail("stream.GetBufferSize() == m_ui16PDULength",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jarvisfriends[P]KDIS/KDIS/PDU/Live_Entity/LE_Fire_PDU.cpp"
                  ,0x2b2,"virtual void KDIS::PDU::LE_Fire_PDU::Encode(KDataStream &) const");
  }
  return;
}

Assistant:

void LE_Fire_PDU::Encode( KDataStream & stream ) const
{
    // We need to cast away the const so we can check the flag values are correct
    // Must check the flags before encoding the header since PDU length may change
    LE_Fire_PDU * self = const_cast<LE_Fire_PDU*>( this );
    self->checkFlagsAndPDULength();

    LE_Header::Encode( stream );

    stream << m_FireFlagUnion.m_ui8Flag;

    // F0: Target Entity ID
    if( m_FireFlagUnion.m_ui8TargetId )
    {
        stream << KDIS_STREAM m_TargetID;
    }

    // F2: Munition ID
    if( m_FireFlagUnion.m_ui8MunitionId )
    {
        // F1: Site Number and Application Number
        if( m_FireFlagUnion.m_ui8MunitionSiteApp )
        {
            stream << KDIS_STREAM m_MunitionID;
        }
        else
        {
            // We cant use the standard encode/decode functions here as not all fields are included.
            stream << m_MunitionID.GetEntityID();
        }
    }

    // F3: Event ID
    if( m_FireFlagUnion.m_ui8EventSiteAppId )
    {
        stream << KDIS_STREAM m_EventID;
    }
    else
    {
        // We cant use the standard encode/decode functions here as not all fields are included.
        stream << m_EventID.GetEntityID();
    }

    // F6: Location
    if( m_FireFlagUnion.m_ui8Location )
    {
        stream << KDIS_STREAM m_Loc;
    }

    // Munition
    stream << KDIS_STREAM m_MunitionDesc.GetType();
    // F4: Warhead and Fuse fields of the Munition Descriptor record
    if( m_FireFlagUnion.m_ui8WarheadFuse )
    {
        stream << ( KUINT16 )m_MunitionDesc.GetWarhead()
               << ( KUINT16 )m_MunitionDesc.GetFuse();
    }
    // F5: Quantity and Rate fields of the Munition Descriptor record
    if( m_FireFlagUnion.m_ui8QuantRate )
    {
        stream << m_MunitionDesc.GetQuantity()
               << m_MunitionDesc.GetRate();
    }

    // Velocity and Range
    stream << KDIS_STREAM m_Vel
           << m_ui16Range;

    assert(stream.GetBufferSize() == m_ui16PDULength);
}